

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cpp
# Opt level: O2

BrotliDecoderErrorCode duckdb_brotli::SkipMetadataBlock(BrotliDecoderStateInternal *s)

{
  ulong uVar1;
  ulong uVar2;
  size_t sVar3;
  uint uVar4;
  uint8_t *puVar5;
  BrotliDecoderErrorCode BVar6;
  uint uVar7;
  size_t sVar8;
  uint8_t buffer [8];
  
  uVar4 = s->meta_block_remaining_len;
  BVar6 = BROTLI_DECODER_SUCCESS;
  if (uVar4 != 0) {
    uVar2 = (s->br).bit_pos_;
    if (7 < uVar2) {
      uVar7 = (int)uVar2 >> 3;
      if ((int)uVar4 <= (int)uVar7) {
        uVar7 = uVar4;
      }
      sVar8 = (size_t)(int)uVar7;
      for (sVar3 = 0; (7 < uVar2 && (sVar8 != sVar3)); sVar3 = sVar3 + 1) {
        uVar1 = (s->br).val_;
        buffer[sVar3] = (uint8_t)uVar1;
        uVar2 = uVar2 - 8;
        (s->br).bit_pos_ = uVar2;
        (s->br).val_ = uVar1 >> 8;
      }
      if (uVar2 < 0x40) {
        (s->br).val_ = (s->br).val_ & ~(-1L << ((byte)uVar2 & 0x3f));
      }
      if (sVar8 != sVar3) {
        puVar5 = (s->br).next_in;
        switchD_016b0717::default(buffer + sVar3,puVar5,sVar8 - sVar3);
        (s->br).next_in = puVar5 + (sVar8 - sVar3);
      }
      if (s->metadata_chunk_func != (brotli_decoder_metadata_chunk_func)0x0) {
        (*s->metadata_chunk_func)(s->metadata_callback_opaque,buffer,sVar8);
        uVar4 = s->meta_block_remaining_len;
      }
      uVar4 = uVar4 - uVar7;
      s->meta_block_remaining_len = uVar4;
      if (uVar4 == 0) {
        return BROTLI_DECODER_SUCCESS;
      }
    }
    puVar5 = (s->br).next_in;
    uVar2 = (long)(s->br).last_in - (long)puVar5;
    uVar7 = 0x40000000;
    if (uVar2 < 0x40000001) {
      uVar7 = (int)((s->br).bit_pos_ >> 3) + (int)uVar2;
    }
    if ((int)uVar4 < (int)uVar7) {
      uVar7 = uVar4;
    }
    if (0 < (int)uVar7) {
      if (s->metadata_chunk_func != (brotli_decoder_metadata_chunk_func)0x0) {
        (*s->metadata_chunk_func)(s->metadata_callback_opaque,puVar5,(size_t)uVar7);
        puVar5 = (s->br).next_in;
        uVar4 = s->meta_block_remaining_len;
      }
      (s->br).next_in = puVar5 + uVar7;
      s->meta_block_remaining_len = uVar4 - uVar7;
      if (uVar4 - uVar7 == 0) {
        return BROTLI_DECODER_SUCCESS;
      }
    }
    BVar6 = BROTLI_DECODER_NEEDS_MORE_INPUT;
  }
  return BVar6;
}

Assistant:

static BrotliDecoderErrorCode BROTLI_NOINLINE SkipMetadataBlock(BrotliDecoderState *s) {
	BrotliBitReader *br = &s->br;

	if (s->meta_block_remaining_len == 0) {
		return BROTLI_DECODER_SUCCESS;
	}

	BROTLI_DCHECK((BrotliGetAvailableBits(br) & 7) == 0);

	/* Drain accumulator. */
	if (BrotliGetAvailableBits(br) >= 8) {
		uint8_t buffer[8];
		int nbytes = (int)(BrotliGetAvailableBits(br)) >> 3;
		BROTLI_DCHECK(nbytes <= 8);
		if (nbytes > s->meta_block_remaining_len) {
			nbytes = s->meta_block_remaining_len;
		}
		BrotliCopyBytes(buffer, br, (size_t)nbytes);
		if (s->metadata_chunk_func) {
			s->metadata_chunk_func(s->metadata_callback_opaque, buffer, (size_t)nbytes);
		}
		s->meta_block_remaining_len -= nbytes;
		if (s->meta_block_remaining_len == 0) {
			return BROTLI_DECODER_SUCCESS;
		}
	}

	/* Direct access to metadata is possible. */
	int nbytes = (int)BrotliGetRemainingBytes(br);
	if (nbytes > s->meta_block_remaining_len) {
		nbytes = s->meta_block_remaining_len;
	}
	if (nbytes > 0) {
		if (s->metadata_chunk_func) {
			s->metadata_chunk_func(s->metadata_callback_opaque, br->next_in, (size_t)nbytes);
		}
		BrotliDropBytes(br, (size_t)nbytes);
		s->meta_block_remaining_len -= nbytes;
		if (s->meta_block_remaining_len == 0) {
			return BROTLI_DECODER_SUCCESS;
		}
	}

	BROTLI_DCHECK(BrotliGetRemainingBytes(br) == 0);

	return BROTLI_DECODER_NEEDS_MORE_INPUT;
}